

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Parameters PVar1;
  Incppect<false> *pIVar2;
  long lVar3;
  char *__s;
  undefined1 auStack_1a8 [16];
  _Any_data local_198;
  code *local_188;
  code *local_180;
  string local_178 [32];
  string httpRoot;
  Parameters parameters;
  Parameters local_a8;
  
  printf("Usage: %s [port] [httpRoot]\n",*argv);
  if (argc < 2) {
    __s = "../examples";
    parameters.portListen = 3000;
  }
  else {
    parameters.portListen = atoi(argv[1]);
    if (argc == 2) {
      __s = "../examples";
    }
    else {
      __s = argv[2];
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&httpRoot,__s,(allocator<char> *)&parameters);
  Incppect<false>::Parameters::Parameters(&parameters);
  parameters.maxPayloadLength_bytes = 0x40000;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198,
                 &httpRoot,"/send");
  std::__cxx11::string::operator=((string *)&parameters.httpRoot,(string *)local_198._M_pod_data);
  std::__cxx11::string::~string((string *)local_198._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198._M_pod_data,"",(allocator<char> *)(auStack_1a8 + 0xf));
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"index.html",(allocator<char> *)(auStack_1a8 + 0xe));
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &parameters.resources,&local_198,&httpRoot);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_198 + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  pIVar2 = Incppect<false>::getInstance();
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = std::
              _Function_handler<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/send/main.cpp:23:37)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/send/main.cpp:23:37)>
              ::_M_manager;
  Incppect<false>::handler((function *)pIVar2);
  std::_Function_base::~_Function_base((_Function_base *)&local_198);
  Incppect<false>::getInstance();
  Incppect<false>::Parameters::Parameters(&local_a8,&parameters);
  PVar1._16_8_ = local_198._M_unused._0_8_;
  PVar1.portListen = auStack_1a8._0_4_;
  PVar1.maxPayloadLength_bytes = auStack_1a8._4_4_;
  PVar1.tLastRequestTimeout_ms = auStack_1a8._8_8_;
  PVar1.httpRoot._M_dataplus._M_p = (pointer)local_198._8_8_;
  PVar1.httpRoot._M_string_length = (size_type)local_188;
  PVar1.httpRoot.field_2._M_allocated_capacity = (size_type)local_180;
  PVar1._48_64_ = _local_178;
  PVar1.sslCert._M_dataplus._M_p._0_4_ = parameters.portListen;
  PVar1.sslCert._M_dataplus._M_p._4_4_ = parameters.maxPayloadLength_bytes;
  PVar1.sslCert._8_24_ = parameters._8_24_;
  Incppect<false>::runAsync(PVar1);
  std::thread::detach();
  std::thread::~thread((thread *)local_198._M_pod_data);
  Incppect<false>::Parameters::~Parameters(&local_a8);
  do {
    local_198._M_unused._M_member_pointer = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_198);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/send";
    parameters.resources = { "", "index.html", };

    // handle input from the clients
    incppect::getInstance().handler([&](int clientId, incppect::EventType etype, std::string_view data) {
        switch (etype) {
            case incppect::Connect:
                {
                    printf("Client %d connected\n", clientId);
                }
                break;
            case incppect::Disconnect:
                {
                    printf("Client %d disconnected\n", clientId);
                }
                break;
            case incppect::Custom:
                {
                    printf("Client %d: '%s'\n", clientId, std::string(data.data(), data.size()).c_str());
                }
                break;
        };
    });

    incppect::getInstance().runAsync(parameters).detach();

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}